

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestDefaultDefault::Run(ParserTestDefaultDefault *this)

{
  Test *pTVar1;
  int iVar2;
  string err;
  vector<Node_*,_std::allocator<Node_*>_> local_60;
  string local_48;
  
  iVar2 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild a: cat foo\nbuild b: cat foo\nbuild c: cat foo\nbuild d: cat foo\n"
            );
  pTVar1 = g_current_test;
  if (iVar2 == g_current_test->assertion_failures_) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    State::DefaultNodes(&local_60,&(this->super_ParserTest).state,&local_48);
    testing::Test::Check
              (pTVar1,(long)local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x409,"4u == state.DefaultNodes(&err).size()");
    if (local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pTVar1 = g_current_test;
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    testing::Test::Check
              (pTVar1,iVar2 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x40a,"\"\" == err");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, DefaultDefault) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build a: cat foo\n"
"build b: cat foo\n"
"build c: cat foo\n"
"build d: cat foo\n"));

  string err;
  EXPECT_EQ(4u, state.DefaultNodes(&err).size());
  EXPECT_EQ("", err);
}